

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

plain_range_sorted<CGlyphIndex>
partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  bool bVar1;
  CGlyphIndex *pCVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  CGlyphIndex *pCVar6;
  uint uVar7;
  long in_FS_OFFSET;
  plain_range_sorted<CGlyphIndex> pVar8;
  plain_range<CGlyphIndex> local_38;
  long local_28;
  
  local_38.end = range.super_plain_range<CGlyphIndex>.end;
  local_38.begin = range.super_plain_range<CGlyphIndex>.begin;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = local_38.end;
  pCVar6 = local_38.begin;
  if (local_38.begin < local_38.end) {
    pCVar2 = plain_range<CGlyphIndex>::back(&local_38);
    iVar4 = value.m_FontSizeIndex;
    bVar1 = pCVar2->m_FontSizeIndex < iVar4;
    if (pCVar2->m_FontSizeIndex == iVar4) {
      bVar1 = pCVar2->m_ID < value.m_ID;
    }
    if (bVar1) {
      pCVar2 = (CGlyphIndex *)0x0;
      pCVar6 = (CGlyphIndex *)0x0;
    }
    else {
      bVar1 = false;
      while (uVar7 = (uint)((ulong)((long)local_38.end - (long)local_38.begin) >> 4),
            pCVar2 = local_38.end, pCVar6 = local_38.begin, 1 < uVar7) {
        uVar7 = uVar7 - 1 >> 1;
        piVar3 = (int *)plain_range<CGlyphIndex>::index(&local_38,(char *)(ulong)uVar7,(uint)bVar1);
        bVar1 = *piVar3 < iVar4;
        if (*piVar3 == iVar4) {
          bVar1 = piVar3[1] < value.m_ID;
        }
        uVar7 = uVar7 + 1;
        if (bVar1 == true) {
          uVar5 = (long)local_38.end - (long)local_38.begin;
          local_38.begin = local_38.begin + uVar7;
          local_38.end = local_38.begin + ((int)(uVar5 >> 4) - 1);
        }
        else {
          local_38.end = local_38.begin + uVar7;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  pVar8.super_plain_range<CGlyphIndex>.end = pCVar2;
  pVar8.super_plain_range<CGlyphIndex>.begin = pCVar6;
  return (plain_range_sorted<CGlyphIndex>)pVar8.super_plain_range<CGlyphIndex>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}